

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O0

void __thiscall
LinearScan::GeneratorBailIn::InsertRestoreSymbols
          (GeneratorBailIn *this,BVSparse<Memory::JitArenaAllocator> *byteCodeUpwardExposedUses,
          BVSparse<Memory::JitArenaAllocator> *upwardExposedUses,CapturedValues *capturedValues,
          BailInInsertionPoint *insertionPoint)

{
  RegNum RVar1;
  Lifetime *lifetime_00;
  code *pcVar2;
  BailInSymbol *this_00;
  bool bVar3;
  IRType IVar4;
  RegNum RVar5;
  RegSlot regSlot_00;
  uint32 offset;
  undefined4 *puVar6;
  Type_conflict node;
  Type *pTVar7;
  StackSym *this_01;
  StackSym *this_02;
  SymOpnd *dst;
  RegOpnd *pRVar8;
  RegOpnd *dstRegOpnd;
  Instr *instr;
  SymOpnd *dstOpnd;
  Opnd *srcOpnd;
  RegSlot regSlot;
  StackSym *copyPropStackSym;
  Lifetime *lifetime;
  StackSym *dstSym;
  BailInSymbol *bailInSymbol;
  Iterator __iter;
  BailInInsertionPoint *insertionPoint_local;
  CapturedValues *capturedValues_local;
  BVSparse<Memory::JitArenaAllocator> *upwardExposedUses_local;
  BVSparse<Memory::JitArenaAllocator> *byteCodeUpwardExposedUses_local;
  GeneratorBailIn *this_local;
  
  __iter.current = (NodeBase *)insertionPoint;
  _bailInSymbol =
       SListBase<LinearScan::GeneratorBailIn::BailInSymbol,_Memory::ArenaAllocator,_RealCount>::
       GetIterator(this->bailInSymbols);
  while( true ) {
    if (__iter.list ==
        (SListBase<LinearScan::GeneratorBailIn::BailInSymbol,_Memory::ArenaAllocator,_RealCount> *)
        0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    this_00 = bailInSymbol;
    node = SListNodeBase<Memory::ArenaAllocator>::Next
                     (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    bVar3 = SListBase<LinearScan::GeneratorBailIn::BailInSymbol,_Memory::ArenaAllocator,_RealCount>
            ::IsHead((SListBase<LinearScan::GeneratorBailIn::BailInSymbol,_Memory::ArenaAllocator,_RealCount>
                      *)this_00,node);
    if (bVar3) break;
    SListNodeBase<Memory::ArenaAllocator>::Next
              (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    pTVar7 = SListBase<LinearScan::GeneratorBailIn::BailInSymbol,_Memory::ArenaAllocator,_RealCount>
             ::Iterator::Data((Iterator *)&bailInSymbol);
    this_01 = SymTable::FindStackSym(this->func->m_symTable,pTVar7->toBackendId);
    lifetime_00 = *(Lifetime **)&(this_01->scratch).globOpt;
    if (lifetime_00 == (Lifetime *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                         ,0x1461,"(lifetime)","lifetime");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    this_02 = SymTable::FindStackSym(this->func->m_symTable,pTVar7->fromByteCodeRegSlot);
    regSlot_00 = StackSym::GetByteCodeRegSlot(this_02);
    if ((pTVar7->field_0x8 & 1) == 0) {
      pRVar8 = this->interpreterFrameRegOpnd;
      offset = GetOffsetFromInterpreterStackFrame(this,regSlot_00);
      IVar4 = StackSym::GetType(this_02);
      dstOpnd = (SymOpnd *)IR::IndirOpnd::New(pRVar8,offset,IVar4,this->func,false);
    }
    else {
      dstOpnd = (SymOpnd *)
                IR::AddrOpnd::New(pTVar7->constValue,AddrOpndKindDynamicVar,this->func,false,
                                  (Var)0x0);
    }
    if ((*(ushort *)&lifetime_00->field_0x9c & 1) == 0) {
      bVar3 = StackSym::IsConst(this_01);
      if (bVar3) {
        dstRegOpnd = (RegOpnd *)
                     InsertLoad(this->linearScan,(Instr *)__iter.current[2].next,this_01,
                                lifetime_00->reg);
      }
      else {
        IVar4 = StackSym::GetType(this_01);
        pRVar8 = IR::RegOpnd::New(this_01,IVar4,this->func);
        IR::RegOpnd::SetReg(pRVar8,lifetime_00->reg);
        dstRegOpnd = (RegOpnd *)
                     InsertMove(&pRVar8->super_Opnd,&dstOpnd->super_Opnd,
                                (Instr *)__iter.current[2].next);
      }
      if (__iter.current[2].next == __iter.current[1].next) {
        __iter.current[1].next = (Type)dstRegOpnd;
      }
      RVar1 = lifetime_00->reg;
      RVar5 = IR::RegOpnd::GetReg(this->interpreterFrameRegOpnd);
      if (RVar1 == RVar5) {
        if (__iter.current[2].next == __iter.current[1].next) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                             ,0x14a0,
                             "(insertionPoint.instrInsertRegSym != insertionPoint.instrInsertStackSym)"
                             ,
                             "insertionPoint.instrInsertRegSym != insertionPoint.instrInsertStackSym"
                            );
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
        __iter.current[2].next = (Type)dstRegOpnd;
        if ((__iter.current)->next != (Type)0x0) {
          IR::Instr::FreeSrc1((Instr *)(__iter.current)->next);
          IR::Instr::SetSrc1((Instr *)(__iter.current)->next,
                             &this->interpreterFrameRegOpnd->super_Opnd);
        }
        (__iter.current)->next = (Type)dstRegOpnd;
      }
      RecordDef(this->linearScan,lifetime_00,(Instr *)dstRegOpnd,0);
    }
    else {
      bVar3 = StackSym::IsConst(this_01);
      if (bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0x1478,"(!dstSym->IsConst())",
                           "We don\'t need to restore constant symbol that has already been spilled"
                          );
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      *(uint *)&this_01->field_0x18 = *(uint *)&this_01->field_0x18 & 0xffffefff | 0x1000;
      IVar4 = StackSym::GetType(this_01);
      dst = IR::SymOpnd::New(&this_01->super_Sym,IVar4,this->func);
      InsertMove(&this->tempRegOpnd->super_Opnd,&dstOpnd->super_Opnd,(Instr *)__iter.current[1].next
                );
      InsertMove(&dst->super_Opnd,&this->tempRegOpnd->super_Opnd,(Instr *)__iter.current[1].next);
    }
  }
  return;
}

Assistant:

void LinearScan::GeneratorBailIn::InsertRestoreSymbols(
    const BVSparse<JitArenaAllocator>& byteCodeUpwardExposedUses,
    const BVSparse<JitArenaAllocator>& upwardExposedUses,
    const CapturedValues& capturedValues,
    BailInInsertionPoint& insertionPoint
)
{
    FOREACH_SLISTBASE_ENTRY(BailInSymbol, bailInSymbol, this->bailInSymbols)
    {
        StackSym* dstSym = this->func->m_symTable->FindStackSym(bailInSymbol.toBackendId);
        Lifetime* lifetime = dstSym->scratch.linearScan.lifetime;
        Assert(lifetime);

        StackSym* copyPropStackSym = this->func->m_symTable->FindStackSym(bailInSymbol.fromByteCodeRegSlot);
        Js::RegSlot regSlot = copyPropStackSym->GetByteCodeRegSlot();
        IR::Opnd* srcOpnd;
        
        if (bailInSymbol.restoreConstDirectly)
        {
            srcOpnd = IR::AddrOpnd::New(bailInSymbol.constValue, IR::AddrOpndKind::AddrOpndKindDynamicVar, this->func);
        }
        else
        {
            srcOpnd = IR::IndirOpnd::New(
                this->interpreterFrameRegOpnd,
                this->GetOffsetFromInterpreterStackFrame(regSlot),
                copyPropStackSym->GetType(),
                this->func
            );
        }

        if (lifetime->isSpilled)
        {
#if DBG
            AssertMsg(!dstSym->IsConst(), "We don't need to restore constant symbol that has already been spilled");
            // Supress assert in DbPostCheckLower
            dstSym->m_allocated = true;
#endif
            // Stack restores require an extra register since we can't move an indir directly to an indir on amd64
            IR::SymOpnd* dstOpnd = IR::SymOpnd::New(dstSym, dstSym->GetType(), this->func);
            LinearScan::InsertMove(this->tempRegOpnd, srcOpnd, insertionPoint.instrInsertStackSym);
            LinearScan::InsertMove(dstOpnd, this->tempRegOpnd, insertionPoint.instrInsertStackSym);
        }
        else
        {
            // Register restores must come after stack restores so that we have RAX and RCX free to
            // use for stack restores and further RAX must be restored last since it holds the
            // pointer to the InterpreterStackFrame from which we are restoring values.
            // We must also track these restores using RecordDef in case the symbols are spilled.

            IR::Instr* instr;

            if (dstSym->IsConst())
            {
                instr = this->linearScan->InsertLoad(insertionPoint.instrInsertRegSym, dstSym, lifetime->reg);
            }
            else
            {
                IR::RegOpnd* dstRegOpnd = IR::RegOpnd::New(dstSym, dstSym->GetType(), this->func);
                dstRegOpnd->SetReg(lifetime->reg);
                instr = LinearScan::InsertMove(dstRegOpnd, srcOpnd, insertionPoint.instrInsertRegSym);
            }

            if (insertionPoint.instrInsertRegSym == insertionPoint.instrInsertStackSym)
            {
                // This is the first register sym, make sure we don't insert stack stores
                // after this instruction so we can ensure rax and rcx remain free to use
                // for restoring spilled stack syms.
                insertionPoint.instrInsertStackSym = instr;
            }

            if (lifetime->reg == interpreterFrameRegOpnd->GetReg())
            {
                // Ensure rax is restored last
                Assert(insertionPoint.instrInsertRegSym != insertionPoint.instrInsertStackSym);

                insertionPoint.instrInsertRegSym = instr;

                if (insertionPoint.raxRestoreInstr != nullptr)
                {
                    // rax was mapped to multiple bytecode registers. Obviously only the first
                    // restore we do will work so change all following stores to `mov rax, rax`.
                    // We still need to keep them around for RecordDef in case the corresponding
                    // dst sym is spilled later on.
                    insertionPoint.raxRestoreInstr->FreeSrc1();
                    insertionPoint.raxRestoreInstr->SetSrc1(this->interpreterFrameRegOpnd);
                }

                insertionPoint.raxRestoreInstr = instr;
            }

            this->linearScan->RecordDef(lifetime, instr, 0);
        }
    }
    NEXT_SLISTBASE_ENTRY;
}